

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

int connection_get_remote_max_frame_size
              (CONNECTION_HANDLE connection,uint32_t *remote_max_frame_size)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (connection == (CONNECTION_HANDLE)0x0 || remote_max_frame_size == (uint32_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x6d0;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_get_remote_max_frame_size",0x6cf,1,
                "Bad arguments: connection = %p, remote_max_frame_size = %p",connection,
                remote_max_frame_size);
    }
  }
  else {
    *remote_max_frame_size = connection->remote_max_frame_size;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int connection_get_remote_max_frame_size(CONNECTION_HANDLE connection, uint32_t* remote_max_frame_size)
{
    int result;

    if ((connection == NULL) ||
        (remote_max_frame_size == NULL))
    {
        LogError("Bad arguments: connection = %p, remote_max_frame_size = %p",
            connection, remote_max_frame_size);
        result = MU_FAILURE;
    }
    else
    {
        *remote_max_frame_size = connection->remote_max_frame_size;

        result = 0;
    }

    return result;
}